

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O0

void sx__coro_invoke(sx_coro_context *ctx,sx_fiber_cb *callback,void *user)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  _Bool _Var4;
  sx__coro_state *node;
  sx_fiber_t pvVar5;
  sx_fiber_stack stack;
  sx_fiber_transfer sVar6;
  sx_fiber_t local_38;
  sx__coro_state *fs;
  void *user_local;
  sx_fiber_cb *callback_local;
  sx_coro_context *ctx_local;
  
  _Var4 = sx_pool_full(ctx->coro_pool);
  if (_Var4) {
    sx_pool_grow(ctx->coro_pool,ctx->alloc,
                 "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                 "void sx__coro_invoke(sx_coro_context *, sx_fiber_cb *, void *)",0xda);
  }
  node = (sx__coro_state *)sx_pool_new(ctx->coro_pool);
  if (node != (sx__coro_state *)0x0) {
    if ((node->init & 1U) == 0) {
      _Var4 = sx_fiber_stack_init(&node->stack_mem,ctx->stack_sz);
      if (!_Var4) {
        sx__mem_run_fail_callback
                  ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",0xe3)
        ;
        sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c"
                          ,0xe3,"Out of memory");
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      node->init = true;
    }
    uVar2 = (node->stack_mem).sptr;
    uVar3 = (node->stack_mem).ssize;
    stack.ssize = uVar3;
    stack.sptr = (void *)uVar2;
    stack._12_4_ = 0;
    pvVar5 = sx_fiber_create(stack,callback);
    node->fiber = pvVar5;
    node->callback = callback;
    node->user = user;
    sx__coro_add_list(&ctx->run_list,&ctx->run_list_last,node);
    ctx->cur_coro = node;
    sVar6 = sx_fiber_switch(node->fiber,user);
    local_38 = sVar6.from;
    node->fiber = local_38;
    return;
  }
  sx__mem_run_fail_callback
            ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",0xdc);
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",0xdc
                    ,"Out of memory");
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void sx__coro_invoke(sx_coro_context* ctx, sx_fiber_cb* callback, void* user)
{
    sx__coro_state* fs = sx_pool_new_and_grow(ctx->coro_pool, ctx->alloc);
    if (!fs) {
        sx_out_of_memory();
        return;
    }

    // Initialize stack memory if not initilized
    if (!fs->init) {
        if (!sx_fiber_stack_init(&fs->stack_mem, ctx->stack_sz)) {
            sx_out_of_memory();
            return;
        }
        fs->init = true;
    }

    fs->fiber = sx_fiber_create(fs->stack_mem, callback);
    fs->callback = callback;
    fs->user = user;
    // Add to the end of the list
    sx__coro_add_list(&ctx->run_list, &ctx->run_list_last, fs);

    ctx->cur_coro = fs;
    fs->fiber = sx_fiber_switch(fs->fiber, user).from;
}